

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

bool cinemo::isValidFileType(string *file,char *ext)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  string fileExt;
  string local_38 [32];
  
  fileExt._M_dataplus._M_p = (pointer)&fileExt.field_2;
  fileExt._M_string_length = 0;
  fileExt.field_2._M_local_buf[0] = '\0';
  lVar2 = std::__cxx11::string::rfind((char)file,0x2e);
  if (lVar2 == -1) {
    bVar3 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_38,(ulong)file);
    std::__cxx11::string::operator=((string *)&fileExt,local_38);
    std::__cxx11::string::~string(local_38);
    iVar1 = strcasecmp(fileExt._M_dataplus._M_p,ext);
    bVar3 = iVar1 == 0;
  }
  std::__cxx11::string::~string((string *)&fileExt);
  return bVar3;
}

Assistant:

bool isValidFileType(const string& file, const char* ext) {
        string fileExt;
        string::size_type i;

        i = file.rfind('.');

        if (i != string::npos) {
            fileExt = file.substr(i + 1);
            return !strcasecmp(fileExt.c_str(), ext);
        }

        return false;
    }